

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

void boost::this_thread::hidden::sleep_until_realtime(timespec *ts)

{
  bool bVar1;
  thread_data_base *ptVar2;
  unique_lock<boost::mutex> lk;
  unique_lock<boost::mutex> local_28;
  
  ptVar2 = detail::get_current_thread_data();
  if (ptVar2 != (thread_data_base *)0x0) {
    local_28.m = &ptVar2->sleep_mutex;
    local_28.is_locked = false;
    unique_lock<boost::mutex>::lock(&local_28);
    do {
      bVar1 = condition_variable::do_wait_until(&ptVar2->sleep_condition,&local_28,ts);
    } while (bVar1);
    if (local_28.is_locked == true) {
      mutex::unlock(local_28.m);
    }
    return;
  }
  no_interruption_point::hidden::sleep_until_realtime(ts);
  return;
}

Assistant:

void BOOST_THREAD_DECL sleep_until_realtime(const timespec& ts)
        {
            boost::detail::thread_data_base* const thread_info=boost::detail::get_current_thread_data();

            if(thread_info)
            {
              unique_lock<mutex> lk(thread_info->sleep_mutex);
              while(thread_info->sleep_condition.do_wait_until(lk,ts)) {}
            }
            else
            {
              boost::this_thread::no_interruption_point::hidden::sleep_until_realtime(ts);
            }
        }